

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_GroundLogisticsVehicle.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GED_GroundLogisticsVehicle::GED_GroundLogisticsVehicle
          (GED_GroundLogisticsVehicle *this,KUINT16 ID,KINT16 XOffset,KINT16 YOffset,KINT16 ZOffset,
          EntityAppearance *EA,KINT8 Psi,KINT8 Theta,KINT8 Phi,KINT8 Speed)

{
  GED::GED(&this->super_GED);
  (this->super_GED).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_GroundLogisticsVehicle_002176a8;
  this->m_ui16EntityID = ID;
  (this->m_EA).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EntityAppearance_00216908
  ;
  (this->m_EA).m_Appearance = EA->m_Appearance;
  this->m_i8Spd = Speed;
  this->m_i16Offsets[0] = XOffset;
  this->m_i16Offsets[1] = YOffset;
  this->m_i16Offsets[2] = ZOffset;
  this->m_i8Ori[0] = Psi;
  this->m_i8Ori[1] = Theta;
  this->m_i8Ori[2] = Phi;
  return;
}

Assistant:

GED_GroundLogisticsVehicle::GED_GroundLogisticsVehicle( KUINT16 ID, KINT16 XOffset, KINT16 YOffset, KINT16 ZOffset, const EntityAppearance & EA, KINT8 Psi, KINT8 Theta,
        KINT8 Phi, KINT8 Speed ) :
    m_ui16EntityID( ID ),
    m_EA( EA ),
    m_i8Spd( Speed )
{
    m_i16Offsets[0] = XOffset;
    m_i16Offsets[1] = YOffset;
    m_i16Offsets[2] = ZOffset;
    m_i8Ori[0] = Psi;
    m_i8Ori[1] = Theta;
    m_i8Ori[2] = Phi;
}